

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.c++
# Opt level: O3

double __thiscall
kj::parse::_::ParseFloat::operator()
          (ParseFloat *this,Array<char> *digits,Maybe<kj::Array<char>_> *fraction,
          Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *exponent)

{
  char *__nptr;
  size_t __n;
  size_t sVar1;
  ulong elementCount;
  char *pcVar2;
  char *ptrCopy;
  char *pcVar3;
  double dVar4;
  char buf_stack [128];
  undefined8 *local_c0;
  char local_b8 [136];
  
  __n = digits->size_;
  sVar1 = __n + (fraction->ptr).field_1.value.size_ + 1;
  if ((fraction->ptr).isSet == false) {
    sVar1 = __n;
  }
  if ((exponent->ptr).isSet == true) {
    sVar1 = sVar1 + *(long *)((long)&(exponent->ptr).field_1 + 0x10) +
            (ulong)(exponent->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value
                   .ptr.isSet + 1;
  }
  elementCount = sVar1 + 1;
  if (elementCount < 0x81) {
    __nptr = local_b8;
    elementCount = 0;
    local_c0 = (undefined8 *)0x0;
    pcVar3 = (char *)0x0;
  }
  else {
    __nptr = (char *)kj::_::HeapArrayDisposer::allocateImpl
                               (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                                (_func_void_void_ptr *)0x0);
    __n = digits->size_;
    local_c0 = &kj::_::HeapArrayDisposer::instance;
    pcVar3 = __nptr;
  }
  memcpy(__nptr,digits->ptr,__n);
  pcVar2 = __nptr + digits->size_;
  if ((fraction->ptr).isSet == true) {
    *pcVar2 = '.';
    memcpy(pcVar2 + 1,(fraction->ptr).field_1.value.ptr,(fraction->ptr).field_1.value.size_);
    pcVar2 = pcVar2 + 1 + (fraction->ptr).field_1.value.size_;
  }
  if ((exponent->ptr).isSet == true) {
    *pcVar2 = 'e';
    if ((exponent->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.isSet
        == true) {
      *(anon_union_1_1_a8c68091_for_NullableValue<char>_2 *)(pcVar2 + 1) =
           (exponent->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.
           field_1;
      pcVar2 = pcVar2 + 2;
    }
    else {
      pcVar2 = pcVar2 + 1;
    }
    memcpy(pcVar2,*(void **)((long)&(exponent->ptr).field_1 + 8),
           *(size_t *)((long)&(exponent->ptr).field_1 + 0x10));
    pcVar2 = pcVar2 + *(long *)((long)&(exponent->ptr).field_1 + 0x10);
  }
  *pcVar2 = '\0';
  dVar4 = strtod(__nptr,(char **)0x0);
  if (pcVar3 != (char *)0x0) {
    (**(code **)*local_c0)(local_c0,pcVar3,1,elementCount,elementCount,0);
  }
  return dVar4;
}

Assistant:

double ParseFloat::operator()(const Array<char>& digits,
                              const Maybe<Array<char>>& fraction,
                              const Maybe<Tuple<Maybe<char>, Array<char>>>& exponent) const {
  size_t bufSize = digits.size();
  KJ_IF_MAYBE(f, fraction) {
    bufSize += 1 + f->size();
  }
  KJ_IF_MAYBE(e, exponent) {
    bufSize += 1 + (get<0>(*e) != nullptr) + get<1>(*e).size();
  }

  KJ_STACK_ARRAY(char, buf, bufSize + 1, 128, 128);

  char* pos = buf.begin();
  memcpy(pos, digits.begin(), digits.size());
  pos += digits.size();
  KJ_IF_MAYBE(f, fraction) {
    *pos++ = '.';
    memcpy(pos, f->begin(), f->size());
    pos += f->size();
  }
  KJ_IF_MAYBE(e, exponent) {
    *pos++ = 'e';
    KJ_IF_MAYBE(sign, get<0>(*e)) {
      *pos++ = *sign;
    }
    memcpy(pos, get<1>(*e).begin(), get<1>(*e).size());
    pos += get<1>(*e).size();
  }

  *pos++ = '\0';
  KJ_DASSERT(pos == buf.end());

  return strtod(buf.begin(), nullptr);
}